

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_2_2_True(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  int iVar2;
  float *pfVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  float *data;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  float *pfVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  float *pfVar37;
  long lVar38;
  long lVar39;
  int iVar40;
  ulong uVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  int k_count;
  int scale;
  int iVar45;
  long lVar46;
  int iVar47;
  float *pfVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  float fVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  undefined1 in_ZMM8 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  undefined1 auVar81 [64];
  int data_width;
  int local_d8;
  
  auVar57._8_4_ = 0x3effffff;
  auVar57._0_8_ = 0x3effffff3effffff;
  auVar57._12_4_ = 0x3effffff;
  auVar56._8_4_ = 0x80000000;
  auVar56._0_8_ = 0x8000000080000000;
  auVar56._12_4_ = 0x80000000;
  fVar63 = ipoint->scale;
  auVar81 = ZEXT464((uint)fVar63);
  auVar49 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)fVar63),auVar56,0xf8);
  auVar49 = ZEXT416((uint)(fVar63 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  fVar62 = -0.08 / (fVar63 * fVar63);
  scale = (int)auVar49._0_4_;
  auVar50._0_4_ = (int)auVar49._0_4_;
  auVar50._4_4_ = (int)auVar49._4_4_;
  auVar50._8_4_ = (int)auVar49._8_4_;
  auVar50._12_4_ = (int)auVar49._12_4_;
  auVar49 = vcvtdq2ps_avx(auVar50);
  auVar50 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)ipoint->x),auVar56,0xf8);
  auVar50 = ZEXT416((uint)(ipoint->x + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51._0_8_ = (double)auVar50._0_4_;
  auVar51._8_8_ = auVar50._8_8_;
  auVar55._0_8_ = (double)fVar63;
  auVar55._8_8_ = 0;
  auVar50 = vfmadd231sd_fma(auVar51,auVar55,ZEXT816(0x3fe0000000000000));
  auVar54._0_4_ = (float)auVar50._0_8_;
  auVar54._4_12_ = auVar50._4_12_;
  auVar50 = vpternlogd_avx512vl(auVar57,ZEXT416((uint)ipoint->y),auVar56,0xf8);
  fVar5 = auVar54._0_4_ - auVar49._0_4_;
  auVar50 = ZEXT416((uint)(ipoint->y + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar52._0_8_ = (double)auVar50._0_4_;
  auVar52._8_8_ = auVar50._8_8_;
  auVar50 = vfmadd231sd_fma(auVar52,auVar55,ZEXT816(0x3fe0000000000000));
  auVar53._0_4_ = (float)auVar50._0_8_;
  auVar53._4_12_ = auVar50._4_12_;
  fVar80 = auVar53._0_4_ - auVar49._0_4_;
  auVar49 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar63),auVar54);
  auVar50 = vpternlogd_avx512vl(auVar57,auVar49,auVar56,0xf8);
  auVar49 = ZEXT416((uint)(auVar49._0_4_ + auVar50._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = ZEXT416((uint)fVar63);
  if (scale < (int)auVar49._0_4_) {
    auVar58._8_4_ = 0x3effffff;
    auVar58._0_8_ = 0x3effffff3effffff;
    auVar58._12_4_ = 0x3effffff;
    auVar59._8_4_ = 0x80000000;
    auVar59._0_8_ = 0x8000000080000000;
    auVar59._12_4_ = 0x80000000;
    auVar49 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar50,auVar53);
    auVar51 = vpternlogd_avx512vl(auVar59,auVar49,auVar58,0xea);
    auVar49 = ZEXT416((uint)(auVar49._0_4_ + auVar51._0_4_));
    auVar49 = vroundss_avx(auVar49,auVar49,0xb);
    if (scale < (int)auVar49._0_4_) {
      auVar49 = vfmadd231ss_fma(auVar54,auVar50,ZEXT416(0x41300000));
      auVar60._8_4_ = 0x80000000;
      auVar60._0_8_ = 0x8000000080000000;
      auVar60._12_4_ = 0x80000000;
      auVar51 = vpternlogd_avx512vl(auVar60,auVar49,auVar58,0xea);
      auVar49 = ZEXT416((uint)(auVar49._0_4_ + auVar51._0_4_));
      auVar49 = vroundss_avx(auVar49,auVar49,0xb);
      if ((int)auVar49._0_4_ + scale <= iimage->width) {
        auVar49 = vfmadd231ss_fma(auVar53,auVar50,ZEXT416(0x41300000));
        auVar16._8_4_ = 0x80000000;
        auVar16._0_8_ = 0x8000000080000000;
        auVar16._12_4_ = 0x80000000;
        auVar51 = vpternlogd_avx512vl(auVar58,auVar49,auVar16,0xf8);
        auVar49 = ZEXT416((uint)(auVar49._0_4_ + auVar51._0_4_));
        auVar49 = vroundss_avx(auVar49,auVar49,0xb);
        if ((int)auVar49._0_4_ + scale <= iimage->height) {
          iVar2 = iimage->data_width;
          pfVar37 = iimage->data;
          iVar47 = scale * 2;
          pfVar33 = haarResponseY + 0x19;
          pfVar48 = haarResponseX + 0x19;
          uVar22 = 0xfffffff4;
          do {
            auVar49._0_4_ = (float)(int)uVar22;
            auVar49._4_12_ = in_ZMM8._4_12_;
            auVar76._0_4_ = (float)(int)(uVar22 | 1);
            auVar76._4_12_ = in_ZMM8._4_12_;
            auVar49 = vfmadd213ss_fma(auVar49,auVar50,ZEXT416((uint)(fVar80 + 0.5)));
            auVar51 = vfmadd213ss_fma(auVar76,auVar50,ZEXT416((uint)(fVar80 + 0.5)));
            iVar19 = (int)auVar49._0_4_;
            iVar25 = (int)auVar51._0_4_;
            iVar20 = (iVar19 + -1) * iVar2;
            iVar18 = (iVar19 + -1 + scale) * iVar2;
            iVar21 = (iVar19 + -1 + iVar47) * iVar2;
            lVar29 = 0;
            iVar26 = (iVar25 + -1) * iVar2;
            iVar19 = (iVar25 + -1 + scale) * iVar2;
            iVar25 = (iVar25 + -1 + iVar47) * iVar2;
            do {
              iVar31 = (int)lVar29 + -0xc;
              auVar73._0_4_ = (float)iVar31;
              auVar73._4_12_ = auVar57._4_12_;
              auVar49 = vfmadd213ss_fma(auVar73,auVar50,ZEXT416((uint)(fVar5 + 0.5)));
              iVar40 = (int)auVar49._0_4_;
              auVar74._0_4_ = (float)((int)lVar29 + -0xb);
              auVar74._4_12_ = auVar57._4_12_;
              auVar49 = vfmadd213ss_fma(auVar74,auVar50,ZEXT416((uint)(fVar5 + 0.5)));
              iVar43 = iVar40 + -1 + scale;
              iVar45 = (int)auVar49._0_4_;
              iVar35 = iVar40 + -1 + iVar47;
              fVar63 = pfVar37[iVar21 + -1 + iVar40];
              fVar66 = pfVar37[iVar20 + iVar35];
              auVar52 = SUB6416(ZEXT464(0x40000000),0);
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar20 + iVar43] -
                                                      pfVar37[iVar21 + iVar43])),auVar52,
                                        ZEXT416((uint)(pfVar37[iVar21 + iVar35] -
                                                      pfVar37[iVar20 + -1 + iVar40])));
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar18 + -1 + iVar40] -
                                                      pfVar37[iVar18 + iVar35])),auVar52,
                                        ZEXT416((uint)(pfVar37[iVar21 + iVar35] -
                                                      pfVar37[iVar20 + -1 + iVar40])));
              pfVar48[lVar29 + -0x19] = (fVar63 - fVar66) + auVar49._0_4_;
              pfVar33[lVar29 + -0x19] = auVar51._0_4_ - (fVar63 - fVar66);
              fVar63 = pfVar37[iVar25 + -1 + iVar40];
              fVar66 = pfVar37[iVar26 + iVar35];
              iVar34 = iVar45 + -1 + scale;
              iVar42 = iVar45 + -1 + iVar47;
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar26 + iVar43] -
                                                      pfVar37[iVar43 + iVar25])),auVar52,
                                        ZEXT416((uint)(pfVar37[iVar35 + iVar25] -
                                                      pfVar37[iVar26 + -1 + iVar40])));
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar19 + -1 + iVar40] -
                                                      pfVar37[iVar19 + iVar35])),auVar52,
                                        ZEXT416((uint)(pfVar37[iVar35 + iVar25] -
                                                      pfVar37[iVar26 + -1 + iVar40])));
              pfVar48[lVar29 + -1] = (fVar63 - fVar66) + auVar49._0_4_;
              pfVar33[lVar29 + -1] = auVar51._0_4_ - (fVar63 - fVar66);
              fVar63 = pfVar37[iVar21 + -1 + iVar45];
              fVar66 = pfVar37[iVar20 + iVar42];
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar20 + iVar34] -
                                                      pfVar37[iVar21 + iVar34])),auVar52,
                                        ZEXT416((uint)(pfVar37[iVar21 + iVar42] -
                                                      pfVar37[iVar20 + -1 + iVar45])));
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar18 + -1 + iVar45] -
                                                      pfVar37[iVar18 + iVar42])),auVar52,
                                        ZEXT416((uint)(pfVar37[iVar21 + iVar42] -
                                                      pfVar37[iVar20 + -1 + iVar45])));
              pfVar48[lVar29 + -0x18] = (fVar63 - fVar66) + auVar49._0_4_;
              pfVar33[lVar29 + -0x18] = auVar51._0_4_ - (fVar63 - fVar66);
              fVar63 = pfVar37[iVar25 + -1 + iVar45];
              fVar66 = pfVar37[iVar26 + iVar42];
              auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar26 + iVar34] -
                                                      pfVar37[iVar34 + iVar25])),auVar52,
                                        ZEXT416((uint)(pfVar37[iVar42 + iVar25] -
                                                      pfVar37[iVar26 + -1 + iVar45])));
              auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar37[iVar19 + -1 + iVar45] -
                                                      pfVar37[iVar19 + iVar42])),auVar52,
                                        ZEXT416((uint)(pfVar37[iVar42 + iVar25] -
                                                      pfVar37[iVar26 + -1 + iVar45])));
              pfVar48[lVar29] = (fVar63 - fVar66) + auVar49._0_4_;
              pfVar33[lVar29] = auVar51._0_4_ - (fVar63 - fVar66);
              lVar29 = lVar29 + 2;
            } while (iVar31 < 10);
            pfVar33 = pfVar33 + 0x30;
            pfVar48 = pfVar48 + 0x30;
            bVar4 = (int)uVar22 < 10;
            uVar22 = uVar22 + 2;
          } while (bVar4);
          goto LAB_001b0d06;
        }
      }
    }
  }
  iVar2 = scale * 2;
  lVar29 = 0;
  uVar22 = 0xfffffff4;
  do {
    auVar64._0_4_ = (float)(int)uVar22;
    auVar64._4_12_ = in_ZMM8._4_12_;
    auVar67._0_4_ = (float)(int)(uVar22 | 1);
    auVar67._4_12_ = in_ZMM8._4_12_;
    auVar49 = vfmadd213ss_fma(auVar64,auVar81._0_16_,ZEXT416((uint)fVar80));
    auVar51 = vfmadd213ss_fma(auVar67,auVar81._0_16_,ZEXT416((uint)fVar80));
    fVar63 = auVar49._0_4_;
    fVar66 = auVar51._0_4_;
    iVar20 = (int)((double)((ulong)(0.0 <= fVar63) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar63) * -0x4020000000000000) + (double)fVar63);
    iVar25 = iVar20 + -1 + scale;
    iVar21 = iVar2 + -1 + iVar20;
    iVar18 = (int)((double)((ulong)(0.0 <= fVar66) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar66) * -0x4020000000000000) + (double)fVar66);
    iVar26 = iVar18 + -1 + scale;
    iVar19 = iVar2 + -1 + iVar18;
    pfVar37 = haarResponseX;
    pfVar48 = haarResponseY;
    lVar28 = lVar29;
    iVar47 = -0xc;
    do {
      auVar65._0_4_ = (float)iVar47;
      auVar65._4_12_ = in_ZMM8._4_12_;
      auVar49 = vfmadd213ss_fma(auVar65,auVar81._0_16_,ZEXT416((uint)fVar5));
      auVar70._0_4_ = (float)(iVar47 + 1);
      auVar70._4_12_ = in_ZMM8._4_12_;
      auVar51 = vfmadd213ss_fma(auVar70,auVar81._0_16_,ZEXT416((uint)fVar5));
      fVar63 = auVar49._0_4_;
      fVar66 = auVar51._0_4_;
      iVar31 = (int)((double)((ulong)(0.0 <= fVar63) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar63) * -0x4020000000000000) + (double)fVar63);
      if (((iVar20 < 1) || (iVar31 < 1)) || (iimage->height < iVar2 + iVar20)) {
LAB_001b0844:
        haarXY(iimage,iVar20,iVar31,scale,(float *)((long)pfVar37 + lVar28),
               (float *)((long)pfVar48 + lVar28));
        iVar40 = iimage->width;
        pfVar37 = haarResponseX;
        pfVar48 = haarResponseY;
      }
      else {
        iVar40 = iimage->width;
        iVar34 = iVar2 + iVar31;
        if (iVar40 < iVar34) goto LAB_001b0844;
        iVar35 = iimage->data_width;
        iVar43 = iVar31 + -1 + scale;
        pfVar33 = iimage->data;
        iVar45 = iVar35 * (iVar20 + -1);
        iVar42 = iVar35 * iVar25;
        iVar35 = iVar35 * iVar21;
        fVar63 = pfVar33[iVar35 + -1 + iVar31];
        fVar6 = pfVar33[iVar45 + -1 + iVar34];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar33[iVar45 + iVar43] - pfVar33[iVar35 + iVar43]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar33[iVar35 + -1 + iVar34] -
                                                pfVar33[iVar45 + -1 + iVar31])));
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar33[iVar42 + -1 + iVar31] -
                                                pfVar33[iVar42 + -1 + iVar34])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar33[iVar35 + -1 + iVar34] -
                                                pfVar33[iVar45 + -1 + iVar31])));
        *(float *)((long)pfVar37 + lVar28) = (fVar63 - fVar6) + auVar49._0_4_;
        *(float *)((long)pfVar48 + lVar28) = auVar51._0_4_ - (fVar63 - fVar6);
      }
      pfVar33 = (float *)((long)pfVar37 + lVar28 + 0x60);
      pfVar1 = (float *)((long)pfVar48 + lVar28 + 0x60);
      if (((iVar18 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar2 + iVar18 || (iVar34 = iVar2 + iVar31, iVar40 < iVar34)))) {
        haarXY(iimage,iVar18,iVar31,scale,pfVar33,pfVar1);
        iVar40 = iimage->width;
        pfVar37 = haarResponseX;
        pfVar48 = haarResponseY;
      }
      else {
        iVar35 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar42 = iVar31 + -1 + scale;
        iVar43 = iVar35 * (iVar18 + -1);
        iVar45 = iVar35 * iVar26;
        iVar35 = iVar35 * iVar19;
        fVar63 = pfVar3[iVar35 + -1 + iVar31];
        fVar6 = pfVar3[iVar43 + -1 + iVar34];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 + iVar42] - pfVar3[iVar35 + iVar42]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar35 + -1 + iVar34] -
                                                pfVar3[iVar43 + -1 + iVar31])));
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar31] -
                                                pfVar3[iVar45 + -1 + iVar34])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar35 + -1 + iVar34] -
                                                pfVar3[iVar43 + -1 + iVar31])));
        *pfVar33 = (fVar63 - fVar6) + auVar49._0_4_;
        *pfVar1 = auVar51._0_4_ - (fVar63 - fVar6);
      }
      pfVar33 = (float *)((long)pfVar37 + lVar28 + 4);
      pfVar1 = (float *)((long)pfVar48 + lVar28 + 4);
      iVar31 = (int)((double)((ulong)(0.0 <= fVar66) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar66) * -0x4020000000000000) + (double)fVar66);
      if (((iVar20 < 1) || (iVar31 < 1)) ||
         ((iimage->height < iVar2 + iVar20 || (iVar34 = iVar2 + iVar31, iVar40 < iVar34)))) {
        haarXY(iimage,iVar20,iVar31,scale,pfVar33,pfVar1);
        iVar40 = iimage->width;
        pfVar37 = haarResponseX;
        pfVar48 = haarResponseY;
      }
      else {
        iVar35 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar43 = iVar31 + -1 + scale;
        iVar42 = iVar35 * (iVar20 + -1);
        iVar45 = iVar35 * iVar25;
        iVar35 = iVar35 * iVar21;
        fVar63 = pfVar3[iVar35 + -1 + iVar31];
        fVar66 = pfVar3[iVar42 + -1 + iVar34];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar42 + iVar43] - pfVar3[iVar35 + iVar43]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar35 + -1 + iVar34] -
                                                pfVar3[iVar42 + -1 + iVar31])));
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar45 + -1 + iVar31] -
                                                pfVar3[iVar45 + -1 + iVar34])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar35 + -1 + iVar34] -
                                                pfVar3[iVar42 + -1 + iVar31])));
        *pfVar33 = (fVar63 - fVar66) + auVar49._0_4_;
        *pfVar1 = auVar51._0_4_ - (fVar63 - fVar66);
      }
      pfVar33 = (float *)((long)pfVar37 + lVar28 + 100);
      pfVar1 = (float *)((long)pfVar48 + lVar28 + 100);
      if ((((iVar18 < 1) || (iVar31 < 1)) || (iimage->height < iVar2 + iVar18)) ||
         (iVar34 = iVar2 + iVar31, iVar40 < iVar34)) {
        haarXY(iimage,iVar18,iVar31,scale,pfVar33,pfVar1);
        pfVar37 = haarResponseX;
        pfVar48 = haarResponseY;
      }
      else {
        iVar40 = iimage->data_width;
        pfVar3 = iimage->data;
        iVar35 = iVar31 + -1 + scale;
        iVar42 = iVar40 * (iVar18 + -1);
        iVar43 = iVar40 * iVar26;
        iVar40 = iVar40 * iVar19;
        fVar63 = pfVar3[iVar40 + -1 + iVar31];
        fVar66 = pfVar3[iVar42 + -1 + iVar34];
        auVar49 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar42 + iVar35] - pfVar3[iVar40 + iVar35]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar40 + -1 + iVar34] -
                                                pfVar3[iVar42 + -1 + iVar31])));
        auVar51 = vfmadd213ss_fma(ZEXT416((uint)(pfVar3[iVar43 + -1 + iVar31] -
                                                pfVar3[iVar43 + -1 + iVar34])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar3[iVar40 + -1 + iVar34] -
                                                pfVar3[iVar42 + -1 + iVar31])));
        *pfVar33 = (fVar63 - fVar66) + auVar49._0_4_;
        *pfVar1 = auVar51._0_4_ - (fVar63 - fVar66);
      }
      auVar81 = ZEXT1664(auVar50);
      lVar28 = lVar28 + 8;
      bVar4 = iVar47 < 10;
      iVar47 = iVar47 + 2;
    } while (bVar4);
    lVar29 = lVar29 + 0xc0;
    bVar4 = (int)uVar22 < 10;
    uVar22 = uVar22 + 2;
  } while (bVar4);
LAB_001b0d06:
  fVar80 = auVar81._0_4_;
  auVar79._8_4_ = 0x3effffff;
  auVar79._0_8_ = 0x3effffff3effffff;
  auVar79._12_4_ = 0x3effffff;
  auVar78._8_4_ = 0x80000000;
  auVar78._0_8_ = 0x8000000080000000;
  auVar78._12_4_ = 0x80000000;
  auVar49 = vpternlogd_avx512vl(auVar79,ZEXT416((uint)(fVar80 * 0.5)),auVar78,0xf8);
  auVar49 = ZEXT416((uint)(fVar80 * 0.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar79,ZEXT416((uint)(fVar80 * 1.5)),auVar78,0xf8);
  auVar50 = ZEXT416((uint)(fVar80 * 1.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar79,ZEXT416((uint)(fVar80 * 2.5)),auVar78,0xf8);
  auVar51 = ZEXT416((uint)(fVar80 * 2.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar79,ZEXT416((uint)(fVar80 * 3.5)),auVar78,0xf8);
  auVar52 = ZEXT416((uint)(fVar80 * 3.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar79,ZEXT416((uint)(fVar80 * 4.5)),auVar78,0xf8);
  auVar53 = ZEXT416((uint)(fVar80 * 4.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar79,ZEXT416((uint)(fVar80 * 5.5)),auVar78,0xf8);
  auVar54 = ZEXT416((uint)(fVar80 * 5.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar79,ZEXT416((uint)(fVar80 * 6.5)),auVar78,0xf8);
  auVar55 = ZEXT416((uint)(fVar80 * 6.5 + auVar55._0_4_));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar79,ZEXT416((uint)(fVar80 * 7.5)),auVar78,0xf8);
  auVar56 = ZEXT416((uint)(auVar56._0_4_ + fVar80 * 7.5));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar79,ZEXT416((uint)(fVar80 * 8.5)),auVar78,0xf8);
  auVar57 = ZEXT416((uint)(fVar80 * 8.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar79,ZEXT416((uint)(fVar80 * 9.5)),auVar78,0xf8);
  auVar58 = ZEXT416((uint)(fVar80 * 9.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar79,ZEXT416((uint)(fVar80 * 10.5)),auVar78,0xf8);
  auVar59 = ZEXT416((uint)(fVar80 * 10.5 + auVar59._0_4_));
  auVar59 = vroundss_avx(auVar59,auVar59,0xb);
  auVar60 = vpternlogd_avx512vl(auVar79,ZEXT416((uint)(fVar80 * 11.5)),auVar78,0xf8);
  fVar69 = auVar51._0_4_;
  fVar63 = fVar69 + auVar50._0_4_;
  fVar5 = fVar69 + auVar49._0_4_;
  auVar51 = ZEXT416((uint)(fVar80 * 11.5 + auVar60._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  fVar80 = fVar69 - auVar49._0_4_;
  fVar66 = fVar69 - auVar50._0_4_;
  fVar6 = fVar69 - auVar52._0_4_;
  fVar7 = fVar69 - auVar53._0_4_;
  fVar8 = fVar69 - auVar54._0_4_;
  fVar69 = fVar69 - auVar55._0_4_;
  fVar77 = auVar56._0_4_;
  fVar9 = fVar77 - auVar52._0_4_;
  fVar10 = fVar77 - auVar53._0_4_;
  fVar11 = fVar77 - auVar54._0_4_;
  fVar12 = fVar77 - auVar55._0_4_;
  fVar13 = fVar77 - auVar57._0_4_;
  fVar14 = fVar77 - auVar58._0_4_;
  fVar15 = fVar77 - auVar59._0_4_;
  fVar77 = fVar77 - auVar51._0_4_;
  gauss_s1_c0[0] = expf(fVar63 * fVar63 * fVar62);
  gauss_s1_c0[1] = expf(fVar5 * fVar5 * fVar62);
  gauss_s1_c0[2] = expf(fVar80 * fVar80 * fVar62);
  gauss_s1_c0[3] = expf(fVar66 * fVar66 * fVar62);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar6 * fVar6 * fVar62);
  gauss_s1_c0[6] = expf(fVar7 * fVar7 * fVar62);
  gauss_s1_c0[7] = expf(fVar8 * fVar8 * fVar62);
  gauss_s1_c0[8] = expf(fVar69 * fVar69 * fVar62);
  gauss_s1_c1[0] = expf(fVar9 * fVar9 * fVar62);
  gauss_s1_c1[1] = expf(fVar10 * fVar10 * fVar62);
  gauss_s1_c1[2] = expf(fVar11 * fVar11 * fVar62);
  gauss_s1_c1[3] = expf(fVar12 * fVar12 * fVar62);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar13 * fVar13 * fVar62);
  gauss_s1_c1[6] = expf(fVar14 * fVar14 * fVar62);
  gauss_s1_c1[7] = expf(fVar15 * fVar15 * fVar62);
  gauss_s1_c1[8] = expf(fVar77 * fVar77 * fVar62);
  auVar68._8_4_ = 0x7fffffff;
  auVar68._0_8_ = 0x7fffffff7fffffff;
  auVar68._12_4_ = 0x7fffffff;
  uVar23 = 0xfffffff8;
  fVar63 = 0.0;
  lVar29 = 0;
  lVar28 = 0;
  local_d8 = 0;
  do {
    pfVar37 = gauss_s1_c1;
    uVar22 = (uint)uVar23;
    if (uVar22 != 7) {
      pfVar37 = gauss_s1_c0;
    }
    lVar44 = (long)local_d8;
    lVar28 = (long)(int)lVar28;
    if (uVar22 == 0xfffffff8) {
      pfVar37 = gauss_s1_c1;
    }
    uVar41 = 0;
    local_d8 = local_d8 + 4;
    uVar36 = 0xfffffff8;
    lVar38 = (long)haarResponseX + lVar29;
    lVar30 = (long)haarResponseY + lVar29;
    do {
      pfVar48 = gauss_s1_c1;
      if (uVar36 != 7) {
        pfVar48 = gauss_s1_c0;
      }
      auVar81 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar36 == 0xfffffff8) {
        pfVar48 = gauss_s1_c1;
      }
      uVar24 = (ulong)(uVar36 >> 0x1c & 0xfffffff8);
      uVar27 = uVar41;
      lVar32 = lVar30;
      lVar46 = lVar38;
      do {
        lVar39 = 0;
        pfVar33 = (float *)((long)pfVar37 + (ulong)(uint)((int)(uVar23 >> 0x1f) << 5));
        do {
          fVar5 = pfVar48[uVar24] * *pfVar33;
          pfVar33 = pfVar33 + (ulong)(~uVar22 >> 0x1f) * 2 + -1;
          auVar49 = vinsertps_avx(ZEXT416(*(uint *)(lVar32 + lVar39 * 4)),
                                  ZEXT416(*(uint *)(lVar46 + lVar39 * 4)),0x10);
          lVar39 = lVar39 + 1;
          auVar75._0_4_ = fVar5 * auVar49._0_4_;
          auVar75._4_4_ = fVar5 * auVar49._4_4_;
          auVar75._8_4_ = fVar5 * auVar49._8_4_;
          auVar75._12_4_ = fVar5 * auVar49._12_4_;
          auVar49 = vandps_avx(auVar75,auVar68);
          auVar49 = vmovlhps_avx(auVar75,auVar49);
          auVar71._0_4_ = auVar81._0_4_ + auVar49._0_4_;
          auVar71._4_4_ = auVar81._4_4_ + auVar49._4_4_;
          auVar71._8_4_ = auVar81._8_4_ + auVar49._8_4_;
          auVar71._12_4_ = auVar81._12_4_ + auVar49._12_4_;
          auVar81 = ZEXT1664(auVar71);
        } while (lVar39 != 9);
        uVar27 = uVar27 + 0x18;
        uVar24 = uVar24 + (ulong)(-1 < (int)uVar36) * 2 + -1;
        lVar46 = lVar46 + 0x60;
        lVar32 = lVar32 + 0x60;
      } while (uVar27 < uVar36 * 0x18 + 0x198);
      uVar36 = uVar36 + 5;
      uVar41 = uVar41 + 0x78;
      fVar5 = gauss_s2_arr[lVar44];
      auVar17._4_4_ = fVar5;
      auVar17._0_4_ = fVar5;
      auVar17._8_4_ = fVar5;
      auVar17._12_4_ = fVar5;
      auVar52 = vmulps_avx512vl(auVar71,auVar17);
      lVar44 = lVar44 + 1;
      auVar72._0_4_ = auVar52._0_4_ * auVar52._0_4_;
      auVar72._4_4_ = auVar52._4_4_ * auVar52._4_4_;
      auVar72._8_4_ = auVar52._8_4_ * auVar52._8_4_;
      auVar72._12_4_ = auVar52._12_4_ * auVar52._12_4_;
      auVar50 = vshufpd_avx(auVar52,auVar52,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar28) = auVar52;
      lVar28 = lVar28 + 4;
      lVar38 = lVar38 + 0x1e0;
      lVar30 = lVar30 + 0x1e0;
      auVar49 = vmovshdup_avx(auVar72);
      auVar51 = vfmadd231ss_fma(auVar49,auVar52,auVar52);
      auVar49 = vshufps_avx(auVar52,auVar52,0xff);
      auVar50 = vfmadd213ss_fma(auVar50,auVar50,auVar51);
      auVar49 = vfmadd213ss_fma(auVar49,auVar49,auVar50);
      fVar63 = fVar63 + auVar49._0_4_;
    } while (local_d8 != (int)lVar44);
    lVar29 = lVar29 + 0x14;
    uVar23 = (ulong)(uVar22 + 5);
  } while ((int)uVar22 < 3);
  if (fVar63 < 0.0) {
    fVar63 = sqrtf(fVar63);
  }
  else {
    auVar49 = vsqrtss_avx(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63));
    fVar63 = auVar49._0_4_;
  }
  lVar29 = 0;
  auVar81 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar63)));
  do {
    auVar61 = vmulps_avx512f(auVar81,*(undefined1 (*) [64])(ipoint->descriptor + lVar29));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar29) = auVar61;
    lVar29 = lVar29 + 0x10;
  } while (lVar29 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_2_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=2, k_count+=2) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=2, k_count+=2) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}